

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_player_prop_type(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  embryo_player_ability *v;
  embryo_player_ability **ppeVar3;
  
  pcVar1 = parser_getstr(p,"type");
  pvVar2 = parser_priv(p);
  v = (embryo_player_ability *)mem_zalloc(0x40);
  ppeVar3 = &embryo_player_abilities;
  if (pvVar2 != (void *)0x0) {
    ppeVar3 = (embryo_player_ability **)((long)pvVar2 + 0x38);
  }
  *ppeVar3 = v;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  (v->ability).type = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_player_prop_type(struct parser *p) {
	const char *type = parser_getstr(p, "type");
	struct embryo_player_ability *h = parser_priv(p);
	struct embryo_player_ability *embryo = mem_zalloc(sizeof *embryo);

	if (h) {
		h->next = embryo;
	} else {
		embryo_player_abilities = embryo;
	}
	parser_setpriv(p, embryo);
	embryo->ability.type = string_make(type);
	return PARSE_ERROR_NONE;
}